

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_sse41_128_32.c
# Opt level: O1

parasail_result_t *
parasail_sw_table_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ulong uVar1;
  int *piVar2;
  uint *puVar3;
  uint uVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  uint uVar7;
  __m128i *palVar8;
  parasail_result_t *result;
  __m128i *b;
  __m128i *palVar9;
  __m128i *palVar10;
  __m128i *b_00;
  long lVar11;
  bool bVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  undefined8 extraout_RDX;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ulong size;
  long lVar20;
  __m128i *ptr;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  int iVar33;
  ulong uVar30;
  int iVar34;
  undefined1 auVar31 [16];
  int iVar35;
  undefined1 auVar32 [16];
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar42;
  int iVar43;
  int iVar44;
  undefined1 auVar41 [16];
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  __m128i c;
  __m128i c_00;
  int32_t column_len;
  uint local_bc;
  ulong local_a0;
  size_t len;
  longlong extraout_RDX_00;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_table_striped_profile_sse41_128_32_cold_8();
  }
  else {
    pvVar5 = (profile->profile32).score;
    if (pvVar5 == (void *)0x0) {
      parasail_sw_table_striped_profile_sse41_128_32_cold_7();
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_sw_table_striped_profile_sse41_128_32_cold_6();
      }
      else {
        uVar4 = profile->s1Len;
        if ((int)uVar4 < 1) {
          parasail_sw_table_striped_profile_sse41_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_table_striped_profile_sse41_128_32_cold_4();
        }
        else {
          uVar16 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sw_table_striped_profile_sse41_128_32_cold_3();
          }
          else if (open < 0) {
            parasail_sw_table_striped_profile_sse41_128_32_cold_2();
          }
          else if (gap < 0) {
            parasail_sw_table_striped_profile_sse41_128_32_cold_1();
          }
          else {
            uVar1 = (ulong)uVar4 + 3;
            uVar13 = 0x7ffffffe - ppVar6->max;
            uVar19 = (ulong)uVar13;
            result = parasail_result_new_table1((uint)uVar1 & 0x7ffffffc,s2Len);
            if (result != (parasail_result_t *)0x0) {
              size = uVar1 >> 2;
              result->flag = result->flag | 0x4420804;
              b = parasail_memalign___m128i(0x10,size);
              palVar9 = parasail_memalign___m128i(0x10,size);
              palVar10 = parasail_memalign___m128i(0x10,size);
              b_00 = parasail_memalign___m128i(0x10,size);
              bVar12 = palVar9 == (__m128i *)0x0 || b == (__m128i *)0x0;
              len = CONCAT71((int7)(uVar19 >> 8),bVar12);
              c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              c[1]._0_1_ = (b_00 == (__m128i *)0x0 || palVar10 == (__m128i *)0x0) || bVar12;
              if ((b_00 != (__m128i *)0x0 && palVar10 != (__m128i *)0x0) &&
                  (palVar9 != (__m128i *)0x0 && b != (__m128i *)0x0)) {
                local_a0 = 0;
                c[0] = size;
                parasail_memset___m128i(b,c,len);
                c_00[1] = extraout_RDX_00;
                c_00[0] = size;
                parasail_memset___m128i(b_00,c_00,len);
                uVar7 = (uint)size;
                lVar18 = size * uVar16;
                local_bc = 0xc0000000;
                uVar21 = 0xc0000000;
                uVar22 = 0xc0000000;
                uVar23 = 0xc0000000;
                uVar24 = 0xc0000000;
                lVar14 = 0;
                uVar19 = 0;
                uVar25 = uVar21;
                uVar26 = uVar22;
                uVar27 = uVar23;
                uVar28 = uVar24;
                do {
                  ptr = b;
                  iVar15 = ppVar6->mapper[(byte)s2[uVar19]];
                  palVar8 = palVar10;
                  b = palVar9;
                  if ((int)local_a0 == (int)uVar19 + -2) {
                    palVar8 = palVar9;
                    b = palVar10;
                  }
                  palVar10 = palVar8;
                  palVar9 = ptr + (uVar7 - 1);
                  iVar37 = (int)(*palVar9)[0];
                  iVar38 = *(int *)((long)*palVar9 + 4);
                  iVar39 = (int)(*palVar9)[1];
                  iVar36 = 0;
                  lVar11 = 0;
                  auVar31 = (undefined1  [16])0x0;
                  lVar17 = lVar14;
                  do {
                    piVar2 = (int *)((long)pvVar5 + lVar11 + size * (long)iVar15 * 0x10);
                    iVar36 = iVar36 + *piVar2;
                    iVar37 = iVar37 + piVar2[1];
                    iVar38 = iVar38 + piVar2[2];
                    iVar39 = iVar39 + piVar2[3];
                    piVar2 = (int *)((long)*b_00 + lVar11);
                    iVar40 = *piVar2;
                    iVar42 = piVar2[1];
                    iVar43 = piVar2[2];
                    iVar44 = piVar2[3];
                    iVar29 = auVar31._0_4_;
                    uVar45 = (uint)(iVar40 < iVar29) * iVar29 | (uint)(iVar40 >= iVar29) * iVar40;
                    iVar33 = auVar31._4_4_;
                    uVar46 = (uint)(iVar42 < iVar33) * iVar33 | (uint)(iVar42 >= iVar33) * iVar42;
                    iVar34 = auVar31._8_4_;
                    uVar47 = (uint)(iVar43 < iVar34) * iVar34 | (uint)(iVar43 >= iVar34) * iVar43;
                    iVar35 = auVar31._12_4_;
                    uVar48 = (uint)(iVar44 < iVar35) * iVar35 | (uint)(iVar44 >= iVar35) * iVar44;
                    uVar45 = (uint)((int)uVar45 < iVar36) * iVar36 |
                             ((int)uVar45 >= iVar36) * uVar45;
                    uVar46 = (uint)((int)uVar46 < iVar37) * iVar37 |
                             ((int)uVar46 >= iVar37) * uVar46;
                    uVar47 = (uint)((int)uVar47 < iVar38) * iVar38 |
                             ((int)uVar47 >= iVar38) * uVar47;
                    uVar48 = (uint)((int)uVar48 < iVar39) * iVar39 |
                             ((int)uVar48 >= iVar39) * uVar48;
                    iVar37 = (-1 < (int)uVar45) * uVar45;
                    iVar36 = (-1 < (int)uVar46) * uVar46;
                    iVar38 = (-1 < (int)uVar47) * uVar47;
                    iVar39 = (-1 < (int)uVar48) * uVar48;
                    piVar2 = (int *)((long)*b + lVar11);
                    *piVar2 = iVar37;
                    piVar2[1] = iVar36;
                    piVar2[2] = iVar38;
                    piVar2[3] = iVar39;
                    piVar2 = ((result->field_4).rowcols)->score_row;
                    *(int *)((long)piVar2 + lVar17) = iVar37;
                    *(int *)((long)piVar2 + lVar18 * 4 + lVar17) = iVar36;
                    *(int *)((long)piVar2 + lVar18 * 8 + lVar17) = iVar38;
                    *(int *)((long)piVar2 + lVar18 * 0xc + lVar17) = iVar39;
                    uVar25 = (uint)((int)uVar25 < iVar37) * iVar37 |
                             ((int)uVar25 >= iVar37) * uVar25;
                    uVar26 = (uint)((int)uVar26 < iVar36) * iVar36 |
                             ((int)uVar26 >= iVar36) * uVar26;
                    uVar27 = (uint)((int)uVar27 < iVar38) * iVar38 |
                             ((int)uVar27 >= iVar38) * uVar27;
                    uVar28 = (uint)((int)uVar28 < iVar39) * iVar39 |
                             ((int)uVar28 >= iVar39) * uVar28;
                    iVar37 = iVar37 - open;
                    iVar36 = iVar36 - open;
                    iVar38 = iVar38 - open;
                    iVar39 = iVar39 - open;
                    iVar40 = iVar40 - gap;
                    iVar42 = iVar42 - gap;
                    iVar43 = iVar43 - gap;
                    iVar44 = iVar44 - gap;
                    puVar3 = (uint *)((long)*b_00 + lVar11);
                    *puVar3 = (uint)(iVar40 < iVar37) * iVar37 | (uint)(iVar40 >= iVar37) * iVar40;
                    puVar3[1] = (uint)(iVar42 < iVar36) * iVar36 | (uint)(iVar42 >= iVar36) * iVar42
                    ;
                    puVar3[2] = (uint)(iVar43 < iVar38) * iVar38 | (uint)(iVar43 >= iVar38) * iVar43
                    ;
                    puVar3[3] = (uint)(iVar44 < iVar39) * iVar39 | (uint)(iVar44 >= iVar39) * iVar44
                    ;
                    iVar29 = iVar29 - gap;
                    iVar33 = iVar33 - gap;
                    iVar34 = iVar34 - gap;
                    iVar35 = iVar35 - gap;
                    auVar31._0_4_ =
                         (uint)(iVar29 < iVar37) * iVar37 | (uint)(iVar29 >= iVar37) * iVar29;
                    auVar31._4_4_ =
                         (uint)(iVar33 < iVar36) * iVar36 | (uint)(iVar33 >= iVar36) * iVar33;
                    auVar31._8_4_ =
                         (uint)(iVar34 < iVar38) * iVar38 | (uint)(iVar34 >= iVar38) * iVar34;
                    auVar31._12_4_ =
                         (uint)(iVar35 < iVar39) * iVar39 | (uint)(iVar35 >= iVar39) * iVar35;
                    piVar2 = (int *)((long)*ptr + lVar11);
                    iVar36 = *piVar2;
                    iVar37 = piVar2[1];
                    iVar38 = piVar2[2];
                    iVar39 = piVar2[3];
                    lVar11 = lVar11 + 0x10;
                    lVar17 = lVar17 + uVar16 * 4;
                  } while (size << 4 != lVar11);
                  iVar15 = 0;
                  do {
                    lVar17 = auVar31._8_8_;
                    uVar30 = auVar31._0_8_;
                    auVar31._0_8_ = uVar30 << 0x20;
                    auVar31._8_8_ = lVar17 << 0x20 | uVar30 >> 0x20;
                    lVar11 = 0;
                    lVar17 = lVar14;
                    do {
                      piVar2 = (int *)((long)*b + lVar11);
                      iVar37 = *piVar2;
                      iVar38 = piVar2[1];
                      iVar39 = piVar2[2];
                      iVar29 = piVar2[3];
                      iVar36 = auVar31._0_4_;
                      uVar45 = (uint)(iVar37 < iVar36) * iVar36 | (uint)(iVar37 >= iVar36) * iVar37;
                      iVar37 = auVar31._4_4_;
                      uVar46 = (uint)(iVar38 < iVar37) * iVar37 | (uint)(iVar38 >= iVar37) * iVar38;
                      iVar38 = auVar31._8_4_;
                      uVar47 = (uint)(iVar39 < iVar38) * iVar38 | (uint)(iVar39 >= iVar38) * iVar39;
                      iVar39 = auVar31._12_4_;
                      uVar48 = (uint)(iVar29 < iVar39) * iVar39 | (uint)(iVar29 >= iVar39) * iVar29;
                      puVar3 = (uint *)((long)*b + lVar11);
                      *puVar3 = uVar45;
                      puVar3[1] = uVar46;
                      puVar3[2] = uVar47;
                      puVar3[3] = uVar48;
                      piVar2 = ((result->field_4).rowcols)->score_row;
                      *(uint *)((long)piVar2 + lVar17) = uVar45;
                      lVar20 = (long)piVar2 + lVar17;
                      *(uint *)(lVar18 * 4 + lVar20) = uVar46;
                      *(uint *)(lVar18 * 8 + lVar20) = uVar47;
                      *(uint *)(lVar18 * 0xc + lVar20) = uVar48;
                      uVar25 = ((int)uVar25 < (int)uVar45) * uVar45 |
                               ((int)uVar25 >= (int)uVar45) * uVar25;
                      uVar26 = ((int)uVar26 < (int)uVar46) * uVar46 |
                               ((int)uVar26 >= (int)uVar46) * uVar26;
                      uVar27 = ((int)uVar27 < (int)uVar47) * uVar47 |
                               ((int)uVar27 >= (int)uVar47) * uVar27;
                      uVar28 = ((int)uVar28 < (int)uVar48) * uVar48 |
                               ((int)uVar28 >= (int)uVar48) * uVar28;
                      auVar31._0_4_ = iVar36 - gap;
                      auVar31._4_4_ = iVar37 - gap;
                      auVar31._8_4_ = iVar38 - gap;
                      auVar31._12_4_ = iVar39 - gap;
                      auVar41._0_4_ = -(uint)((int)(uVar45 - open) < (int)auVar31._0_4_);
                      auVar41._4_4_ = -(uint)((int)(uVar46 - open) < (int)auVar31._4_4_);
                      auVar41._8_4_ = -(uint)((int)(uVar47 - open) < (int)auVar31._8_4_);
                      auVar41._12_4_ = -(uint)((int)(uVar48 - open) < (int)auVar31._12_4_);
                      iVar36 = movmskps((int)lVar20,auVar41);
                      if (iVar36 == 0) goto LAB_006a4826;
                      lVar11 = lVar11 + 0x10;
                      lVar17 = lVar17 + uVar16 * 4;
                    } while (size << 4 != lVar11);
                    iVar15 = iVar15 + 1;
                  } while (iVar15 != 4);
LAB_006a4826:
                  auVar32._0_4_ = -(uint)((int)uVar21 < (int)uVar25);
                  auVar32._4_4_ = -(uint)((int)uVar22 < (int)uVar26);
                  auVar32._8_4_ = -(uint)((int)uVar23 < (int)uVar27);
                  auVar32._12_4_ = -(uint)((int)uVar24 < (int)uVar28);
                  iVar15 = movmskps(iVar15,auVar32);
                  bVar12 = true;
                  if (iVar15 != 0) {
                    uVar45 = ((int)uVar27 < (int)uVar25) * uVar25 |
                             ((int)uVar27 >= (int)uVar25) * uVar27;
                    uVar46 = ((int)uVar28 < (int)uVar26) * uVar26 |
                             ((int)uVar28 >= (int)uVar26) * uVar28;
                    local_bc = ((int)uVar46 < (int)uVar45) * uVar45 |
                               ((int)uVar46 >= (int)uVar45) * uVar46;
                    if ((int)uVar13 < (int)local_bc) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                      bVar12 = false;
                    }
                    else {
                      local_a0 = uVar19 & 0xffffffff;
                      uVar21 = local_bc;
                      uVar22 = local_bc;
                      uVar23 = local_bc;
                      uVar24 = local_bc;
                    }
                  }
                  iVar15 = (int)uVar19;
                  if (!bVar12) break;
                  uVar19 = uVar19 + 1;
                  lVar14 = lVar14 + 4;
                  palVar9 = ptr;
                  iVar15 = s2Len;
                } while (uVar19 != uVar16);
                if (local_bc == 0x7fffffff) {
                  *(byte *)&result->flag = (byte)result->flag | 0x40;
                }
                iVar36 = parasail_result_is_saturated(result);
                palVar9 = palVar10;
                if (iVar36 == 0) {
                  iVar36 = (int)local_a0;
                  palVar8 = ptr;
                  if (iVar36 == iVar15 + -2) {
                    palVar9 = ptr;
                    palVar8 = palVar10;
                  }
                  if (iVar36 == iVar15 + -1) {
                    palVar9 = b;
                    b = palVar10;
                    palVar8 = ptr;
                  }
                  ptr = palVar8;
                  iVar15 = uVar4 - 1;
                  if ((uVar1 & 0x7ffffffc) != 0) {
                    uVar16 = 0;
                    do {
                      if ((*(uint *)((long)*palVar9 + uVar16 * 4) == local_bc) &&
                         (iVar37 = ((uint)uVar16 & 3) * uVar7 + ((uint)(uVar16 >> 2) & 0x3fffffff),
                         iVar37 < iVar15)) {
                        iVar15 = iVar37;
                      }
                      uVar16 = uVar16 + 1;
                    } while ((uVar7 & 0x1fffffff) << 2 != (int)uVar16);
                  }
                }
                else {
                  iVar36 = 0;
                  local_bc = 0x7fffffff;
                  iVar15 = 0;
                }
                result->score = local_bc;
                result->end_query = iVar15;
                result->end_ref = iVar36;
                parasail_free(b_00);
                parasail_free(palVar9);
                parasail_free(ptr);
                parasail_free(b);
                return result;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvE = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    __m128i vNegInf;
    int32_t score = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int32_t maxp = 0;
    /*int32_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    vZero = _mm_setzero_si128();
    vNegInf = _mm_set1_epi32(NEG_INF);
    score = NEG_INF;
    vMaxH = vNegInf;
    vMaxHUnit = vNegInf;
    maxp = INT32_MAX - (int32_t)(matrix->max+1);
    /*stop = profile->stop == INT32_MAX ?  INT32_MAX : (int32_t)profile->stop;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi32(-open), segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vF;
        __m128i vH;
        const __m128i* vP = NULL;
        __m128i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 4);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi32(vH, vE);
            vH = _mm_max_epi32(vH, vF);
            vH = _mm_max_epi32(vH, vZero);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi32(vH, vMaxH);

            /* Update vE value. */
            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm_slli_si128(vF, 4);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm_max_epi32(vH, vMaxH);
                vH = _mm_sub_epi32(vH, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm_max_epi32(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi32_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi32(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (score == INT32_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT32_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m128i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m128i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int32_t *t = (int32_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}